

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_memory_storage.cpp
# Opt level: O0

void __thiscall
cppcms::sessions::session_memory_storage_factory::session_memory_storage_factory
          (session_memory_storage_factory *this)

{
  undefined8 *puVar1;
  shared_ptr<cppcms::sessions::session_storage> *in_RDI;
  session_memory_storage *in_stack_ffffffffffffffc8;
  session_memory_storage *in_stack_fffffffffffffff0;
  
  session_storage_factory::session_storage_factory((session_storage_factory *)in_RDI);
  (in_RDI->super___shared_ptr<cppcms::sessions::session_storage,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       = (element_type *)&PTR_get_0052f748;
  puVar1 = (undefined8 *)operator_new(0x70);
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  session_memory_storage::session_memory_storage(in_stack_fffffffffffffff0);
  std::shared_ptr<cppcms::sessions::session_storage>::
  shared_ptr<cppcms::sessions::session_memory_storage,void>(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

session_memory_storage_factory::session_memory_storage_factory() :
	storage_(new session_memory_storage())
{
}